

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

int av1_active_v_edge(AV1_COMP *cpi,int mi_col,int mi_step)

{
  STATS_BUFFER_CTX *pSVar1;
  int iVar2;
  FIRSTPASS_STATS *pFVar3;
  int iVar4;
  long lVar5;
  
  iVar2 = (cpi->common).mi_params.mi_cols;
  iVar4 = 0;
  if (AOM_RC_FIRST_PASS < (cpi->oxcf).pass) {
    lVar5 = (long)(int)(cpi->common).current_frame.display_order_hint;
    if (lVar5 < 0) {
      return 1;
    }
    pSVar1 = (cpi->ppi->twopass).stats_buf_ctx;
    pFVar3 = pSVar1->stats_in_start;
    if (pFVar3 == (FIRSTPASS_STATS *)0x0) {
      return 1;
    }
    pFVar3 = pFVar3 + lVar5;
    if (pSVar1->stats_in_end < pFVar3) {
      return 1;
    }
    iVar4 = (int)(pFVar3->inactive_zone_cols * 4.0);
    iVar2 = iVar2 - iVar4;
    if (iVar2 <= iVar4) {
      iVar2 = iVar4;
    }
  }
  if ((iVar4 < mi_col || mi_step + mi_col <= iVar4) && (mi_step + mi_col <= iVar2 || iVar2 < mi_col)
     ) {
    return 0;
  }
  return 1;
}

Assistant:

int av1_active_v_edge(const AV1_COMP *cpi, int mi_col, int mi_step) {
  int left_edge = 0;
  int right_edge = cpi->common.mi_params.mi_cols;
  int is_active_v_edge = 0;

  // For two pass account for any formatting bars detected.
  if (is_stat_consumption_stage_twopass(cpi)) {
    const AV1_COMMON *const cm = &cpi->common;
    const FIRSTPASS_STATS *const this_frame_stats = read_one_frame_stats(
        &cpi->ppi->twopass, cm->current_frame.display_order_hint);
    if (this_frame_stats == NULL) return AOM_CODEC_ERROR;

    // The inactive region is specified in MBs not mi units.
    // The image edge is in the following MB row.
    left_edge += (int)(this_frame_stats->inactive_zone_cols * 4);

    right_edge -= (int)(this_frame_stats->inactive_zone_cols * 4);
    right_edge = AOMMAX(left_edge, right_edge);
  }

  if (((left_edge >= mi_col) && (left_edge < (mi_col + mi_step))) ||
      ((right_edge >= mi_col) && (right_edge < (mi_col + mi_step)))) {
    is_active_v_edge = 1;
  }
  return is_active_v_edge;
}